

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::encodeArray
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  unsigned_long *puVar1;
  ulong uVar2;
  long *plVar3;
  logic_error *this_00;
  size_type *psVar4;
  long *plVar5;
  uint32_t *out_00;
  size_t length_00;
  size_t thisnvalue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  checkifdivisibleby(length,0x80);
  *out = (uint32_t)length;
  uVar2 = *nvalue;
  *nvalue = 1;
  if (length != 0) {
    puVar1 = in + length;
    out_00 = out + 1;
    do {
      length_00 = (long)puVar1 - (long)in >> 3;
      if (in + this->PageSize < puVar1) {
        length_00 = (ulong)this->PageSize;
      }
      local_f0 = (undefined1 *)0x0;
      __encodeArray(this,in,length_00,out_00,(size_t *)&local_f0);
      *nvalue = (size_t)(local_f0 + *nvalue);
      out_00 = out_00 + (long)local_f0;
      in = in + length_00;
    } while (in != puVar1);
  }
  if (*nvalue <= uVar2) {
    resetBuffer(this);
    return;
  }
  local_f0 = local_e0;
  local_e8 = 0;
  local_e0[0] = 0;
  std::__cxx11::to_string(&local_b0,uVar2 << 2);
  std::operator+(&local_90,"It is possible we have a buffer overrun. You reported having allocated "
                 ,&local_b0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_110._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar4) {
    local_110.field_2._M_allocated_capacity = *psVar4;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar4;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::to_string(&local_d0,*nvalue << 2);
  std::operator+(&local_70,&local_110,&local_d0);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_50 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void encodeArray(const IntType *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const IntType *const finalin(in + length);

    *out++ = static_cast<uint32_t>(length);
    const size_t oldnvalue = nvalue;
    nvalue = 1;
    while (in != finalin) {
      size_t thissize = static_cast<size_t>(
          finalin > PageSize + in ? PageSize : (finalin - in));
      size_t thisnvalue(0);
      __encodeArray(in, thissize, out, thisnvalue);
      nvalue += thisnvalue;
      out += thisnvalue;
      in += thissize;
    }
    if (oldnvalue < nvalue) {
      std::string msg;
      msg = "It is possible we have a buffer overrun. You reported having "
            "allocated "
          + std::to_string(oldnvalue * sizeof(uint32_t))
          + " bytes for the compressed data but we needed "
          + std::to_string(nvalue * sizeof(uint32_t))
          + " bytes. Please increase the available memory"
            " for compressed data or check the value of the last parameter "
            "provided "
            " to the encodeArray method.";
      throw std::logic_error(msg);
    }
    resetBuffer();  // if you don't do this, the buffer has a memory
  }